

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_qpromise_all.cpp
# Opt level: O0

void anon_unknown.dwarf_33e8c::
     SequenceTester<std::__cxx11::list<QtPromise::QPromise<void>,_std::allocator<QtPromise::QPromise<void>_>_>_>
     ::exec(void)

{
  initializer_list<QtPromise::QPromise<void>_> __l;
  bool bVar1;
  byte bVar2;
  int iVar3;
  _Self *__x;
  QPromise<void> *local_e0;
  int local_d0 [3];
  bool local_c2;
  bool local_c1;
  undefined1 local_c0 [8];
  QPromise<void> p;
  value_type local_a8;
  _List_iterator<QtPromise::QPromise<void>_> local_98;
  const_iterator local_90;
  value_type local_88;
  allocator<QtPromise::QPromise<void>_> local_75 [13];
  QPromise<void> *local_68;
  QPromise<void> local_60;
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  QPromise<void> local_30;
  undefined1 local_20 [8];
  list<QtPromise::QPromise<void>,_std::allocator<QtPromise::QPromise<void>_>_> promises;
  
  local_68 = &local_60;
  QtPromise::resolve();
  local_68 = (QPromise<void> *)local_50;
  QtPromise::resolve();
  local_68 = (QPromise<void> *)local_40;
  QtPromise::resolve();
  local_30.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&local_60;
  local_30.super_QPromiseBase<void>.m_d.d = (PromiseData<void> *)0x3;
  std::allocator<QtPromise::QPromise<void>_>::allocator(local_75);
  __l._M_len = (size_type)local_30.super_QPromiseBase<void>.m_d.d;
  __l._M_array = (iterator)local_30.super_QPromiseBase<void>._vptr_QPromiseBase;
  std::__cxx11::list<QtPromise::QPromise<void>,_std::allocator<QtPromise::QPromise<void>_>_>::list
            ((list<QtPromise::QPromise<void>,_std::allocator<QtPromise::QPromise<void>_>_> *)
             local_20,__l,local_75);
  std::allocator<QtPromise::QPromise<void>_>::~allocator(local_75);
  local_e0 = &local_30;
  do {
    local_e0 = local_e0 + -1;
    QtPromise::QPromise<void>::~QPromise(local_e0);
  } while (local_e0 != &local_60);
  QtPromise::resolve();
  std::__cxx11::list<QtPromise::QPromise<void>,_std::allocator<QtPromise::QPromise<void>_>_>::
  push_back((list<QtPromise::QPromise<void>,_std::allocator<QtPromise::QPromise<void>_>_> *)local_20
            ,&local_88);
  QtPromise::QPromise<void>::~QPromise(&local_88);
  local_98._M_node =
       (_List_node_base *)
       std::__cxx11::list<QtPromise::QPromise<void>,_std::allocator<QtPromise::QPromise<void>_>_>::
       begin((list<QtPromise::QPromise<void>,_std::allocator<QtPromise::QPromise<void>_>_> *)
             local_20);
  __x = std::_List_iterator<QtPromise::QPromise<void>_>::operator++(&local_98);
  std::_List_const_iterator<QtPromise::QPromise<void>_>::_List_const_iterator(&local_90,__x);
  QtPromise::resolve();
  p.super_QPromiseBase<void>.m_d.d =
       (PromiseData<void> *)
       std::__cxx11::list<QtPromise::QPromise<void>,_std::allocator<QtPromise::QPromise<void>_>_>::
       insert((list<QtPromise::QPromise<void>,_std::allocator<QtPromise::QPromise<void>_>_> *)
              local_20,local_90,&local_a8);
  QtPromise::QPromise<void>::~QPromise(&local_a8);
  std::__cxx11::list<QtPromise::QPromise<void>,_std::allocator<QtPromise::QPromise<void>_>_>::
  pop_back((list<QtPromise::QPromise<void>,_std::allocator<QtPromise::QPromise<void>_>_> *)local_20)
  ;
  QtPromise::QPromise<void>::all<std::__cxx11::list,_std::allocator<QtPromise::QPromise<void>_>_>
            ((QPromise<void> *)local_c0,
             (list<QtPromise::QPromise<void>,_std::allocator<QtPromise::QPromise<void>_>_> *)
             local_20);
  local_c1 = QtPromise::QPromiseBase<void>::isPending((QPromiseBase<void> *)local_c0);
  local_c2 = true;
  bVar1 = QTest::qCompare<bool,bool>
                    (&local_c1,&local_c2,"p.isPending()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_qpromise_all.cpp"
                     ,0x49);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_d0[1] = 0xffffffff;
    local_d0[0] = 0x2a;
    iVar3 = waitForValue<int>((QPromise<void> *)local_c0,local_d0 + 1,local_d0);
    bVar2 = QTest::qCompare(iVar3,0x2a,"waitForValue(p, -1, 42)","42",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_qpromise_all.cpp"
                            ,0x4a);
    if (((bVar2 ^ 0xff) & 1) == 0) {
      local_d0[2] = 0;
    }
    else {
      local_d0[2] = 1;
    }
  }
  else {
    local_d0[2] = 1;
  }
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)local_c0);
  std::__cxx11::list<QtPromise::QPromise<void>,_std::allocator<QtPromise::QPromise<void>_>_>::~list
            ((list<QtPromise::QPromise<void>,_std::allocator<QtPromise::QPromise<void>_>_> *)
             local_20);
  return;
}

Assistant:

static void exec()
    {
        Sequence<QtPromise::QPromise<void>, Args...> promises{QtPromise::resolve(),
                                                              QtPromise::resolve(),
                                                              QtPromise::resolve()};

        promises.push_back(QtPromise::resolve());
        promises.insert(++promises.begin(), QtPromise::resolve());
        promises.pop_back();

        auto p = QtPromise::QPromise<void>::all(promises);

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<void>>::value));

        QCOMPARE(p.isPending(), true);
        QCOMPARE(waitForValue(p, -1, 42), 42);
    }